

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O3

unsigned_long __thiscall
o3dgc::BinaryStream::ReadUInt32Bin(BinaryStream *this,unsigned_long *position)

{
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  O3DGCEndianness OVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = *position;
  if (uVar5 < (this->m_stream).m_size - 4) {
    OVar4 = this->m_endianness;
    *position = uVar5 + 1;
    bVar1 = (this->m_stream).m_buffer[uVar5];
    if (OVar4 == O3DGC_BIG_ENDIAN) {
      *position = uVar5 + 2;
      bVar3 = (this->m_stream).m_buffer[uVar5 + 1];
      *position = uVar5 + 3;
      uVar6 = (ulong)(this->m_stream).m_buffer[uVar5 + 2] << 8 |
              (ulong)bVar3 << 0x10 | (long)(int)((uint)bVar1 << 0x18);
      *position = uVar5 + 4;
      uVar5 = (ulong)(this->m_stream).m_buffer[uVar5 + 3];
    }
    else {
      *position = uVar5 + 2;
      uVar2 = (this->m_stream).m_buffer[uVar5 + 1];
      *position = uVar5 + 3;
      uVar6 = (ulong)CONCAT12((this->m_stream).m_buffer[uVar5 + 2],CONCAT11(uVar2,bVar1));
      *position = uVar5 + 4;
      uVar5 = (ulong)(int)((uint)(this->m_stream).m_buffer[uVar5 + 3] << 0x18);
    }
    return uVar5 | uVar6;
  }
  __assert_fail("position < m_stream.GetSize() - 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcBinaryStream.h"
                ,0xf0,"unsigned long o3dgc::BinaryStream::ReadUInt32Bin(unsigned long &) const");
}

Assistant:

unsigned long           ReadUInt32Bin(unsigned long & position)  const
                                {
                                    assert(position < m_stream.GetSize() - 4);
                                    unsigned long value = 0;
                                    if (m_endianness == O3DGC_BIG_ENDIAN)
                                    {
                                        value += (m_stream[position++]<<24);
                                        value += (m_stream[position++]<<16);
                                        value += (m_stream[position++]<<8);
                                        value += (m_stream[position++]);
                                    }
                                    else
                                    {
                                        value += (m_stream[position++]);
                                        value += (m_stream[position++]<<8);
                                        value += (m_stream[position++]<<16);
                                        value += (m_stream[position++]<<24);
                                    }
                                    return value;
                                }